

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV1SoftSkinBlock(Parser *this)

{
  char *pcVar1;
  bool bVar2;
  __type _Var3;
  ulong uVar4;
  reference pMVar5;
  vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> *this_00;
  reference this_01;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_> *this_02;
  Bone local_100;
  uint local_e0;
  uint local_dc;
  uint n;
  pair<int,_float> me;
  uint w;
  string bone;
  BoneVertex *vert;
  pointer ppStack_a0;
  pointer local_98;
  uint local_84;
  uint local_80;
  uint numWeights;
  uint i;
  __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
  local_70;
  iterator it;
  allocator local_51;
  undefined1 local_50 [8];
  string name;
  uint diff;
  char *sz;
  reference pMStack_18;
  uint numVerts;
  Mesh *curMesh;
  Parser *this_local;
  
  curMesh = (Mesh *)this;
  do {
    if (*this->filePtr == '}') {
      this->filePtr = this->filePtr + 1;
      return;
    }
    if (*this->filePtr == '\0') {
      return;
    }
    if (*this->filePtr == '{') {
      this->filePtr = this->filePtr + 1;
    }
    else {
      pMStack_18 = (reference)0x0;
      sz._4_4_ = 0;
      pcVar1 = this->filePtr;
      while (bVar2 = IsSpaceOrNewLine<char>(*this->filePtr), ((bVar2 ^ 0xffU) & 1) != 0) {
        this->filePtr = this->filePtr + 1;
      }
      name.field_2._12_4_ = (int)this->filePtr - (int)pcVar1;
      if (name.field_2._12_4_ != 0) {
        uVar4 = (ulong)(uint)name.field_2._12_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_50,pcVar1,uVar4,&local_51);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
        local_70._M_current =
             (Mesh *)std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::begin
                               (&this->m_vMeshes);
        while( true ) {
          _i = std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::end
                         (&this->m_vMeshes);
          bVar2 = __gnu_cxx::operator!=
                            (&local_70,
                             (__normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                              *)&i);
          if (!bVar2) break;
          pMVar5 = __gnu_cxx::
                   __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                   ::operator*(&local_70);
          _Var3 = std::operator==(&(pMVar5->super_BaseNode).mName,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_50);
          if (_Var3) {
            pMStack_18 = __gnu_cxx::
                         __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                         ::operator*(&local_70);
            break;
          }
          __gnu_cxx::
          __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
          ::operator++(&local_70);
        }
        if (pMStack_18 == (reference)0x0) {
          LogWarning(this,"Encountered unknown mesh in *MESH_SOFTSKINVERTS section");
          while (SkipSpacesAndLineEnd<char>(&this->filePtr), *this->filePtr != '}') {
            bVar2 = IsNumeric<char>(*this->filePtr);
            if (!bVar2) goto LAB_00633a4e;
            SkipLine<char>(&this->filePtr);
          }
          this->filePtr = this->filePtr + 1;
          numWeights = 1;
        }
        else {
          SkipSpacesAndLineEnd<char>(&this->filePtr);
          ParseLV4MeshLong(this,(uint *)((long)&sz + 4));
          std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::reserve
                    (&pMStack_18->mBoneVertices,(ulong)sz._4_4_);
          for (local_80 = 0; local_80 < sz._4_4_; local_80 = local_80 + 1) {
            SkipSpacesAndLineEnd<char>(&this->filePtr);
            ParseLV4MeshLong(this,&local_84);
            this_00 = &pMStack_18->mBoneVertices;
            vert = (BoneVertex *)0x0;
            ppStack_a0 = (pointer)0x0;
            local_98 = (pointer)0x0;
            BoneVertex::BoneVertex((BoneVertex *)&vert);
            std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::
            push_back(this_00,(BoneVertex *)&vert);
            BoneVertex::~BoneVertex((BoneVertex *)&vert);
            this_01 = std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                      ::back(&pMStack_18->mBoneVertices);
            std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::reserve
                      (&this_01->mBoneWeights,(ulong)local_84);
            std::__cxx11::string::string((string *)&me.second);
            for (me.first = 0; (uint)me.first < local_84; me.first = me.first + 1) {
              std::__cxx11::string::clear();
              ParseString(this,(string *)&me.second,"*MESH_SOFTSKINVERTS.Bone");
              std::pair<int,_float>::pair<int,_float,_true>
                        ((pair<int,_float> *)&stack0xffffffffffffff24);
              local_dc = 0xffffffff;
              for (local_e0 = 0; uVar4 = (ulong)local_e0,
                  sVar6 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::size
                                    (&pMStack_18->mBones), uVar4 < sVar6; local_e0 = local_e0 + 1) {
                __lhs = &std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::
                         operator[](&pMStack_18->mBones,(ulong)local_e0)->mName;
                _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&me.second);
                if (_Var3) {
                  local_dc = local_e0;
                  break;
                }
              }
              if (local_dc == 0xffffffff) {
                sVar6 = std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::size
                                  (&pMStack_18->mBones);
                local_dc = (uint)sVar6;
                this_02 = &pMStack_18->mBones;
                Bone::Bone(&local_100,(string *)&me.second);
                std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::push_back
                          (this_02,&local_100);
                Bone::~Bone(&local_100);
              }
              ParseLV4MeshFloat(this,(ai_real *)&n);
              std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::push_back
                        (&this_01->mBoneWeights,(value_type *)&stack0xffffffffffffff24);
            }
            std::__cxx11::string::~string((string *)&me.second);
          }
LAB_00633a4e:
          numWeights = 0;
        }
        std::__cxx11::string::~string((string *)local_50);
        if (numWeights != 0) {
          return;
        }
      }
    }
    this->filePtr = this->filePtr + 1;
    SkipSpacesAndLineEnd<char>(&this->filePtr);
  } while( true );
}

Assistant:

void Parser::ParseLV1SoftSkinBlock()
{
    // TODO: fix line counting here

    // **************************************************************
    // The soft skin block is formatted differently. There are no
    // nested sections supported and the single elements aren't
    // marked by keywords starting with an asterisk.

    /**
    FORMAT BEGIN

    *MESH_SOFTSKINVERTS {
    <nodename>
    <number of vertices>

    [for <number of vertices> times:]
        <number of weights> [for <number of weights> times:] <bone name> <weight>
    }

    FORMAT END
    */
    // **************************************************************
    while (true)
    {
        if (*filePtr == '}'      )  {++filePtr;return;}
        else if (*filePtr == '\0')  return;
        else if (*filePtr == '{' )  ++filePtr;

        else // if (!IsSpace(*filePtr) && !IsLineEnd(*filePtr))
        {
            ASE::Mesh* curMesh      = NULL;
            unsigned int numVerts   = 0;

            const char* sz = filePtr;
            while (!IsSpaceOrNewLine(*filePtr))++filePtr;

            const unsigned int diff = (unsigned int)(filePtr-sz);
            if (diff)
            {
                std::string name = std::string(sz,diff);
                for (std::vector<ASE::Mesh>::iterator it = m_vMeshes.begin();
                    it != m_vMeshes.end(); ++it)
                {
                    if ((*it).mName == name)
                    {
                        curMesh = & (*it);
                        break;
                    }
                }
                if (!curMesh)
                {
                    LogWarning("Encountered unknown mesh in *MESH_SOFTSKINVERTS section");

                    // Skip the mesh data - until we find a new mesh
                    // or the end of the *MESH_SOFTSKINVERTS section
                    while (true)
                    {
                        SkipSpacesAndLineEnd(&filePtr);
                        if (*filePtr == '}')
                            {++filePtr;return;}
                        else if (!IsNumeric(*filePtr))
                            break;

                        SkipLine(&filePtr);
                    }
                }
                else
                {
                    SkipSpacesAndLineEnd(&filePtr);
                    ParseLV4MeshLong(numVerts);

                    // Reserve enough storage
                    curMesh->mBoneVertices.reserve(numVerts);

                    for (unsigned int i = 0; i < numVerts;++i)
                    {
                        SkipSpacesAndLineEnd(&filePtr);
                        unsigned int numWeights;
                        ParseLV4MeshLong(numWeights);

                        curMesh->mBoneVertices.push_back(ASE::BoneVertex());
                        ASE::BoneVertex& vert = curMesh->mBoneVertices.back();

                        // Reserve enough storage
                        vert.mBoneWeights.reserve(numWeights);

                        std::string bone;
                        for (unsigned int w = 0; w < numWeights;++w) {
                            bone.clear();
                            ParseString(bone,"*MESH_SOFTSKINVERTS.Bone");

                            // Find the bone in the mesh's list
                            std::pair<int,ai_real> me;
                            me.first = -1;

                            for (unsigned int n = 0; n < curMesh->mBones.size();++n) {
                                if (curMesh->mBones[n].mName == bone) {
                                    me.first = n;
                                    break;
                                }
                            }
                            if (-1 == me.first) {
                                // We don't have this bone yet, so add it to the list
                                me.first = static_cast<int>( curMesh->mBones.size() );
                                curMesh->mBones.push_back( ASE::Bone( bone ) );
                            }
                            ParseLV4MeshFloat( me.second );

                            // Add the new bone weight to list
                            vert.mBoneWeights.push_back(me);
                        }
                    }
                }
            }
        }
        ++filePtr;
        SkipSpacesAndLineEnd(&filePtr);
    }
}